

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

bool libcellml::hasUnitsImports(UnitsPtr *units)

{
  element_type *peVar1;
  bool bVar2;
  size_t sVar3;
  const_iterator cVar4;
  size_t index;
  string reference;
  ModelPtr model;
  string local_70;
  ParentedEntityConstPtr local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  bVar2 = ImportedEntity::isImport
                    (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_ImportedEntity);
  local_70._M_dataplus._M_p =
       (pointer)(units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70._M_string_length =
       (size_type)
       (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length)->_M_use_count
           + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length)->_M_use_count
           + 1;
    }
  }
  owningModel(&local_50);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length);
  }
  sVar3 = Units::unitCount((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr);
  if (sVar3 != 0 && !bVar2) {
    index = 0;
    do {
      Units::unitAttributeReference_abi_cxx11_
                (&local_70,
                 (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 index);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0022879f:
        bVar2 = false;
      }
      else {
        bVar2 = isStandardUnitName(&local_70);
        peVar1 = local_50.
                 super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (bVar2) goto LAB_0022879f;
        cVar4 = Model::ModelImpl::findUnits
                          (*(ModelImpl **)
                            ((long)local_50.
                                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 8),&local_70);
        if (cVar4._M_current ==
            *(shared_ptr<libcellml::Units> **)(*(size_type *)((long)peVar1 + 8) + 0x90))
        goto LAB_0022879f;
        Model::units((Model *)&stack0xffffffffffffffc0,
                     (string *)
                     local_50.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        bVar2 = hasUnitsImports((UnitsPtr *)&stack0xffffffffffffffc0);
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      index = index + 1;
    } while (index < sVar3 && bVar2 == false);
  }
  if (local_50.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return bVar2;
}

Assistant:

bool hasUnitsImports(const UnitsPtr &units)
{
    bool importPresent = units->isImport();
    auto model = owningModel(units);
    size_t unistCount = units->unitCount();
    for (size_t index = 0; !importPresent && (index < unistCount); ++index) {
        std::string reference = units->unitAttributeReference(index);
        if (!reference.empty() && !isStandardUnitName(reference)) {
            if (model->hasUnits(reference)) {
                importPresent = hasUnitsImports(model->units(reference));
            }
        }
    }
    return importPresent;
}